

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceObjectArchive.cpp
# Opt level: O0

string * __thiscall
Diligent::DeviceObjectArchive::ToString_abi_cxx11_
          (string *__return_storage_ptr__,DeviceObjectArchive *this)

{
  pointer this_00;
  bool bVar1;
  bool bVar2;
  ResourceType RVar3;
  _Setw _Var4;
  ostream *poVar5;
  reference __args;
  vector<std::reference_wrapper<std::pair<Diligent::DeviceObjectArchive::NamedResourceKey_const,Diligent::DeviceObjectArchive::ResourceData>const>,std::allocator<std::reference_wrapper<std::pair<Diligent::DeviceObjectArchive::NamedResourceKey_const,Diligent::DeviceObjectArchive::ResourceData>const>>>
  *this_01;
  iterator pvVar6;
  const_reference this_02;
  pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>
  *this_03;
  char *pcVar7;
  size_type sVar8;
  ulong uVar9;
  const_reference pvVar10;
  unsigned_long *puVar11;
  size_t sVar12;
  void *pvVar13;
  const_iterator pvVar14;
  reference this_04;
  size_t sVar15;
  reference pvVar16;
  const_reference this_05;
  size_t sVar17;
  uint local_534;
  int iStack_530;
  Uint32 idx;
  size_t SizeFieldW_1;
  size_t IdxFieldW;
  allocator<char> local_512;
  undefined1 local_511;
  undefined1 *local_510;
  undefined8 local_508;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_500;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0;
  undefined1 local_4a0 [8];
  Serializer<(Diligent::SerializerMode)0> ShaderSer;
  ShaderCreateInfo ShaderCI;
  SerializedData *ShaderData;
  const_iterator __end4;
  const_iterator __begin4;
  value_type *__range4;
  size_t MaxNameLen;
  size_t MaxSize_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ShaderNames;
  value_type *Shaders_1;
  Uint32 dev;
  value_type *Shaders;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  array<std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>,_7UL>
  *__range2_2;
  bool HasShaders;
  size_t DevDataSize_1;
  Uint32 i_1;
  int local_348;
  size_t SizeFieldW;
  size_t local_338;
  size_t DevDataSize;
  int iStack_328;
  Uint32 i;
  size_t MaxDevNameLen;
  size_t MaxSize;
  ResourceData *Res;
  pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>
  *it_1;
  reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>
  *res_ref;
  const_iterator __end3;
  const_iterator __begin3;
  value_type *__range3;
  ResourceType ResType;
  value_type *Resources;
  iterator __end2_1;
  iterator __begin2_1;
  array<std::vector<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::allocator<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>_>,_8UL>
  *__range2_1;
  value_type *it;
  const_iterator __end2;
  const_iterator __begin2;
  unordered_map<Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>
  *__range2;
  array<std::vector<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::allocator<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>_>,_8UL>
  ResourcesByType;
  anon_class_1_0_00000001 GetNumFieldWidth;
  char CommonDataName [7];
  char Ident2 [5];
  char cStack_1c7;
  char cStack_1c6;
  char cStack_1c5;
  char Ident1 [3];
  char cStack_1c1;
  char SeparatorLine [20];
  stringstream local_1a0 [8];
  stringstream Output;
  ostream local_190 [376];
  DeviceObjectArchive *local_18;
  DeviceObjectArchive *this_local;
  
  local_18 = this;
  this_local = (DeviceObjectArchive *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::operator<<(local_190,"Archive contents:\n");
  Ident2[4] = '-';
  cStack_1c7 = '-';
  cStack_1c6 = '-';
  cStack_1c5 = '-';
  Ident1[0] = '-';
  Ident1[1] = '-';
  Ident1[2] = '-';
  cStack_1c1 = '-';
  Ident2[2] = '\0';
  Ident2[0] = ' ';
  Ident2[1] = ' ';
  _GetNumFieldWidth = 0x20202020;
  poVar5 = std::operator<<(local_190,"Header\n");
  poVar5 = std::operator<<(poVar5,Ident2);
  poVar5 = std::operator<<(poVar5,"Archive version: ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,8);
  poVar5 = std::operator<<(poVar5,'\n');
  poVar5 = std::operator<<(poVar5,Ident2);
  poVar5 = std::operator<<(poVar5,"Content version: ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->m_ContentVersion);
  std::operator<<(poVar5,'\n');
  stack0xfffffffffffffe25 = 0x6d6d6f43;
  std::
  array<std::vector<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::allocator<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>_>,_8UL>
  ::array((array<std::vector<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::allocator<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>_>,_8UL>
           *)&__range2);
  __end2 = std::
           unordered_map<Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>
           ::begin(&this->m_NamedResources);
  it = (value_type *)
       std::
       unordered_map<Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>
       ::end(&this->m_NamedResources);
  while (bVar1 = std::__detail::operator!=
                           (&__end2.
                             super__Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false>
                            ,(_Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false>
                              *)&it), bVar1) {
    __args = std::__detail::
             _Node_const_iterator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false,_false>
             ::operator*(&__end2);
    RVar3 = NamedResourceKey::GetType(&__args->first);
    this_01 = (vector<std::reference_wrapper<std::pair<Diligent::DeviceObjectArchive::NamedResourceKey_const,Diligent::DeviceObjectArchive::ResourceData>const>,std::allocator<std::reference_wrapper<std::pair<Diligent::DeviceObjectArchive::NamedResourceKey_const,Diligent::DeviceObjectArchive::ResourceData>const>>>
               *)std::
                 array<std::vector<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::allocator<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>_>,_8UL>
                 ::operator[]((array<std::vector<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::allocator<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>_>,_8UL>
                               *)&__range2,(ulong)RVar3);
    std::
    vector<std::reference_wrapper<std::pair<Diligent::DeviceObjectArchive::NamedResourceKey_const,Diligent::DeviceObjectArchive::ResourceData>const>,std::allocator<std::reference_wrapper<std::pair<Diligent::DeviceObjectArchive::NamedResourceKey_const,Diligent::DeviceObjectArchive::ResourceData>const>>>
    ::
    emplace_back<std::pair<Diligent::DeviceObjectArchive::NamedResourceKey_const,Diligent::DeviceObjectArchive::ResourceData>const&>
              (this_01,__args);
    std::__detail::
    _Node_const_iterator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false,_false>
    ::operator++(&__end2);
  }
  __end2_1 = std::
             array<std::vector<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::allocator<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>_>,_8UL>
             ::begin((array<std::vector<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::allocator<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>_>,_8UL>
                      *)&__range2);
  pvVar6 = std::
           array<std::vector<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::allocator<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>_>,_8UL>
           ::end((array<std::vector<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::allocator<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>_>,_8UL>
                  *)&__range2);
  for (; __end2_1 != pvVar6; __end2_1 = __end2_1 + 1) {
    bVar1 = std::
            vector<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::allocator<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>_>
            ::empty(__end2_1);
    if (!bVar1) {
      this_02 = std::
                vector<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::allocator<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>_>
                ::front(__end2_1);
      this_03 = std::
                reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>
                ::get(this_02);
      RVar3 = NamedResourceKey::GetType(&this_03->first);
      poVar5 = std::operator<<(local_190,Ident2 + 4);
      pcVar7 = anon_unknown_25::ResourceTypeToString(RVar3);
      poVar5 = std::operator<<(poVar5,pcVar7);
      poVar5 = std::operator<<(poVar5," (");
      sVar8 = std::
              vector<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::allocator<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>_>
              ::size(__end2_1);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar8);
      std::operator<<(poVar5,")\n");
      __end3 = std::
               vector<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::allocator<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>_>
               ::begin(__end2_1);
      res_ref = (reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>
                 *)std::
                   vector<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::allocator<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>_>
                   ::end(__end2_1);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<const_std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_*,_std::vector<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::allocator<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>_>_>
                                         *)&res_ref), bVar1) {
        it_1 = (pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>
                *)__gnu_cxx::
                  __normal_iterator<const_std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_*,_std::vector<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::allocator<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>_>_>
                  ::operator*(&__end3);
        Res = (ResourceData *)
              std::
              reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>
              ::get((reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>
                     *)it_1);
        poVar5 = std::operator<<(local_190,Ident2);
        pcVar7 = NamedResourceKey::GetName((NamedResourceKey *)Res);
        poVar5 = std::operator<<(poVar5,pcVar7);
        std::operator<<(poVar5,'\n');
        MaxSize = (size_t)&(Res->Common).m_Hash;
        MaxDevNameLen = SerializedData::Size((SerializedData *)MaxSize);
        _iStack_328 = 6;
        for (DevDataSize._4_4_ = 0; uVar9 = (ulong)DevDataSize._4_4_,
            sVar8 = std::array<Diligent::SerializedData,_7UL>::size
                              ((array<Diligent::SerializedData,_7UL> *)(MaxSize + 0x20)),
            uVar9 < sVar8; DevDataSize._4_4_ = DevDataSize._4_4_ + 1) {
          pvVar10 = std::array<Diligent::SerializedData,_7UL>::operator[]
                              ((array<Diligent::SerializedData,_7UL> *)(MaxSize + 0x20),
                               (ulong)DevDataSize._4_4_);
          local_338 = SerializedData::Size(pvVar10);
          puVar11 = std::max<unsigned_long>(&MaxDevNameLen,&local_338);
          MaxDevNameLen = *puVar11;
          if (local_338 != 0) {
            pcVar7 = anon_unknown_25::ArchiveDeviceTypeToString(DevDataSize._4_4_);
            SizeFieldW = strlen(pcVar7);
            puVar11 = std::max<unsigned_long>((unsigned_long *)&stack0xfffffffffffffcd8,&SizeFieldW)
            ;
            _iStack_328 = *puVar11;
          }
        }
        sVar12 = const::$_0::operator()
                           ((__0 *)((long)&ResourcesByType._M_elems[7].
                                           super__Vector_base<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::allocator<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),
                            MaxDevNameLen);
        poVar5 = std::operator<<(local_190,(char *)&GetNumFieldWidth);
        _Var4 = std::setw(iStack_328);
        poVar5 = std::operator<<(poVar5,_Var4);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::left);
        poVar5 = std::operator<<(poVar5,(char *)((long)&ResourcesByType._M_elems[7].
                                                                                                                
                                                  super__Vector_base<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::allocator<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                + 5));
        poVar5 = std::operator<<(poVar5,' ');
        local_348 = (int)sVar12;
        _Var4 = std::setw(local_348);
        poVar5 = std::operator<<(poVar5,_Var4);
        pvVar13 = (void *)std::ostream::operator<<(poVar5,std::right);
        sVar12 = SerializedData::Size((SerializedData *)MaxSize);
        poVar5 = (ostream *)std::ostream::operator<<(pvVar13,sVar12);
        std::operator<<(poVar5," bytes\n");
        for (DevDataSize_1._4_4_ = 0;
            sVar8 = std::array<Diligent::SerializedData,_7UL>::size
                              ((array<Diligent::SerializedData,_7UL> *)(MaxSize + 0x20)),
            DevDataSize_1._4_4_ < sVar8; DevDataSize_1._4_4_ = DevDataSize_1._4_4_ + 1) {
          pvVar10 = std::array<Diligent::SerializedData,_7UL>::operator[]
                              ((array<Diligent::SerializedData,_7UL> *)(MaxSize + 0x20),
                               (ulong)DevDataSize_1._4_4_);
          sVar12 = SerializedData::Size(pvVar10);
          if (sVar12 != 0) {
            poVar5 = std::operator<<(local_190,(char *)&GetNumFieldWidth);
            _Var4 = std::setw(iStack_328);
            poVar5 = std::operator<<(poVar5,_Var4);
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::left);
            pcVar7 = anon_unknown_25::ArchiveDeviceTypeToString(DevDataSize_1._4_4_);
            poVar5 = std::operator<<(poVar5,pcVar7);
            poVar5 = std::operator<<(poVar5,' ');
            _Var4 = std::setw(local_348);
            poVar5 = std::operator<<(poVar5,_Var4);
            pvVar13 = (void *)std::ostream::operator<<(poVar5,std::right);
            poVar5 = (ostream *)std::ostream::operator<<(pvVar13,sVar12);
            std::operator<<(poVar5," bytes\n");
          }
        }
        __gnu_cxx::
        __normal_iterator<const_std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_*,_std::vector<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::allocator<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>_>_>
        ::operator++(&__end3);
      }
    }
  }
  std::
  array<std::vector<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::allocator<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>_>,_8UL>
  ::~array((array<std::vector<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::allocator<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>_>,_8UL>
            *)&__range2);
  bVar1 = false;
  __end2_2 = std::
             array<std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>,_7UL>
             ::begin(&this->m_DeviceShaders);
  pvVar14 = std::
            array<std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>,_7UL>
            ::end(&this->m_DeviceShaders);
  for (; __end2_2 != pvVar14; __end2_2 = __end2_2 + 1) {
    bVar2 = std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>::empty
                      (__end2_2);
    if (!bVar2) {
      bVar1 = true;
    }
  }
  if (bVar1) {
    poVar5 = std::operator<<(local_190,Ident2 + 4);
    std::operator<<(poVar5,"Compiled Shaders\n");
    for (Shaders_1._4_4_ = 0;
        sVar8 = std::
                array<std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>,_7UL>
                ::size(&this->m_DeviceShaders), Shaders_1._4_4_ < sVar8;
        Shaders_1._4_4_ = Shaders_1._4_4_ + 1) {
      ShaderNames.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)std::
                    array<std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>,_7UL>
                    ::operator[](&this->m_DeviceShaders,(ulong)Shaders_1._4_4_);
      bVar1 = std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>::
              empty((vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_> *)
                    ShaderNames.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (!bVar1) {
        poVar5 = std::operator<<(local_190,Ident2);
        pcVar7 = anon_unknown_25::ArchiveDeviceTypeToString(Shaders_1._4_4_);
        poVar5 = std::operator<<(poVar5,pcVar7);
        poVar5 = std::operator<<(poVar5,'(');
        sVar8 = std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>::
                size((vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_> *)
                     ShaderNames.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar8);
        std::operator<<(poVar5,")\n");
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&MaxSize_1);
        sVar8 = std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>::
                size((vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_> *)
                     ShaderNames.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&MaxSize_1,sVar8);
        this_00 = ShaderNames.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        MaxNameLen = 0;
        __range4 = (value_type *)0x0;
        __end4 = std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>::
                 begin((vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>
                        *)ShaderNames.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        ShaderData = (SerializedData *)
                     std::
                     vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>::
                     end((vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>
                          *)this_00);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end4,(__normal_iterator<const_Diligent::SerializedData_*,_std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>_>
                                           *)&ShaderData), bVar1) {
          this_04 = __gnu_cxx::
                    __normal_iterator<const_Diligent::SerializedData_*,_std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>_>
                    ::operator*(&__end4);
          ShaderCI.WebGPUEmulatedArrayIndexSuffix = (char *)SerializedData::Size(this_04);
          puVar11 = std::max<unsigned_long>
                              (&MaxNameLen,(unsigned_long *)&ShaderCI.WebGPUEmulatedArrayIndexSuffix
                              );
          MaxNameLen = *puVar11;
          ShaderCreateInfo::ShaderCreateInfo((ShaderCreateInfo *)&ShaderSer.m_Ptr);
          Serializer<(Diligent::SerializerMode)0>::Serializer
                    ((Serializer<(Diligent::SerializerMode)0> *)local_4a0,this_04);
          bVar1 = ShaderSerializer<(Diligent::SerializerMode)0>::SerializeCI
                            ((Serializer<(Diligent::SerializerMode)0> *)local_4a0,
                             (ConstQual<ShaderCreateInfo> *)&ShaderSer.m_Ptr);
          if (bVar1) {
            local_511 = 0x27;
            local_510 = &local_511;
            local_508 = 1;
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_500,local_510,local_508,&local_512);
            std::operator+(&local_4e0,&local_500,(char *)ShaderCI.Macros._8_8_);
            std::operator+(&local_4c0,&local_4e0,'\'');
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &MaxSize_1,&local_4c0);
            std::__cxx11::string::~string((string *)&local_4c0);
            std::__cxx11::string::~string((string *)&local_4e0);
            std::__cxx11::string::~string((string *)&local_500);
            std::allocator<char>::~allocator(&local_512);
          }
          else {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<char_const(&)[24]>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &MaxSize_1,(char (*) [24])"<Deserialization error>");
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&MaxSize_1);
          IdxFieldW = std::__cxx11::string::size();
          puVar11 = std::max<unsigned_long>((unsigned_long *)&__range4,&IdxFieldW);
          __range4 = (value_type *)*puVar11;
          __gnu_cxx::
          __normal_iterator<const_Diligent::SerializedData_*,_std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>_>
          ::operator++(&__end4);
        }
        sVar8 = std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>::
                size((vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_> *)
                     ShaderNames.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
        sVar12 = const::$_0::operator()
                           ((__0 *)((long)&ResourcesByType._M_elems[7].
                                           super__Vector_base<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::allocator<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),
                            sVar8);
        sVar15 = const::$_0::operator()
                           ((__0 *)((long)&ResourcesByType._M_elems[7].
                                           super__Vector_base<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::allocator<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),
                            MaxNameLen);
        for (local_534 = 0;
            sVar8 = std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>
                    ::size((vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>
                            *)ShaderNames.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage), local_534 < sVar8
            ; local_534 = local_534 + 1) {
          poVar5 = std::operator<<(local_190,(char *)&GetNumFieldWidth);
          poVar5 = std::operator<<(poVar5,'[');
          SizeFieldW_1._0_4_ = (int)sVar12;
          _Var4 = std::setw((int)SizeFieldW_1);
          poVar5 = std::operator<<(poVar5,_Var4);
          pvVar13 = (void *)std::ostream::operator<<(poVar5,std::right);
          poVar5 = (ostream *)std::ostream::operator<<(pvVar13,local_534);
          poVar5 = std::operator<<(poVar5,"] ");
          _Var4 = std::setw((int)__range4);
          poVar5 = std::operator<<(poVar5,_Var4);
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::left);
          pvVar16 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&MaxSize_1,(ulong)local_534);
          poVar5 = std::operator<<(poVar5,(string *)pvVar16);
          poVar5 = std::operator<<(poVar5,' ');
          iStack_530 = (int)sVar15;
          _Var4 = std::setw(iStack_530);
          poVar5 = std::operator<<(poVar5,_Var4);
          pvVar13 = (void *)std::ostream::operator<<(poVar5,std::right);
          this_05 = std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>
                    ::operator[]((vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>
                                  *)ShaderNames.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (ulong)local_534);
          sVar17 = SerializedData::Size(this_05);
          poVar5 = (ostream *)std::ostream::operator<<(pvVar13,sVar17);
          std::operator<<(poVar5," bytes\n");
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&MaxSize_1);
      }
    }
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string DeviceObjectArchive::ToString() const
{
    std::stringstream Output;
    Output << "Archive contents:\n";

    constexpr char SeparatorLine[] = "------------------\n";
    constexpr char Ident1[]        = "  ";
    constexpr char Ident2[]        = "    ";

    // Print header
    {
        Output << "Header\n"
               << Ident1 << "Archive version: " << ArchiveVersion << '\n'
               << Ident1 << "Content version: " << m_ContentVersion << '\n';
    }

    constexpr char CommonDataName[] = "Common";

    auto GetNumFieldWidth = [](auto Number) //
    {
        size_t Width = 1;
        for (; Number >= 10; Number /= 10)
            ++Width;
        return Width;
    };

    // Print resources, e.g.:
    //
    //   ------------------
    //   Resource Signatures (1)
    //     Test PRS
    //       Common     1015 bytes
    //       OpenGL      729 bytes
    //       Direct3D11  384 bytes
    //       Direct3D12  504 bytes
    //       Vulkan      881 bytes
    {
        std::array<std::vector<std::reference_wrapper<const decltype(m_NamedResources)::value_type>>, static_cast<size_t>(ResourceType::Count)> ResourcesByType;
        for (const auto& it : m_NamedResources)
        {
            ResourcesByType[static_cast<size_t>(it.first.GetType())].emplace_back(it);
        }

        for (const auto& Resources : ResourcesByType)
        {
            if (Resources.empty())
                continue;

            const auto ResType = Resources.front().get().first.GetType();
            Output << SeparatorLine
                   << ResourceTypeToString(ResType) << " (" << Resources.size() << ")\n";
            // ------------------
            // Resource Signatures (1)

            for (const auto& res_ref : Resources)
            {
                const auto& it = res_ref.get();
                Output << Ident1 << it.first.GetName() << '\n';
                // ..Test PRS

                const auto& Res = it.second;

                auto   MaxSize       = Res.Common.Size();
                size_t MaxDevNameLen = strlen(CommonDataName);
                for (Uint32 i = 0; i < Res.DeviceSpecific.size(); ++i)
                {
                    const auto DevDataSize = Res.DeviceSpecific[i].Size();

                    MaxSize = std::max(MaxSize, DevDataSize);
                    if (DevDataSize != 0)
                        MaxDevNameLen = std::max(MaxDevNameLen, strlen(ArchiveDeviceTypeToString(i)));
                }
                const auto SizeFieldW = GetNumFieldWidth(MaxSize);

                Output << Ident2 << std::setw(static_cast<int>(MaxDevNameLen)) << std::left << CommonDataName << ' '
                       << std::setw(static_cast<int>(SizeFieldW)) << std::right << Res.Common.Size() << " bytes\n";
                // ....Common     1015 bytes

                for (Uint32 i = 0; i < Res.DeviceSpecific.size(); ++i)
                {
                    const auto DevDataSize = Res.DeviceSpecific[i].Size();
                    if (DevDataSize > 0)
                    {
                        Output << Ident2 << std::setw(static_cast<int>(MaxDevNameLen)) << std::left << ArchiveDeviceTypeToString(i) << ' '
                               << std::setw(static_cast<int>(SizeFieldW)) << std::right << DevDataSize << " bytes\n";
                        // ....OpenGL      729 bytes
                    }
                }
            }
        }
    }

    // Print shaders, e.g.
    //
    //   ------------------
    //   Shaders
    //     OpenGL(2)
    //       [0] 'Test VS' 4020 bytes
    //       [1] 'Test PS' 4020 bytes
    //     Vulkan(2)
    //       [0] 'Test VS' 8364 bytes
    //       [1] 'Test PS' 7380 bytes
    {
        bool HasShaders = false;
        for (const auto& Shaders : m_DeviceShaders)
        {
            if (!Shaders.empty())
                HasShaders = true;
        }

        if (HasShaders)
        {
            Output << SeparatorLine
                   << "Compiled Shaders\n";
            // ------------------
            // Compiled Shaders

            for (Uint32 dev = 0; dev < m_DeviceShaders.size(); ++dev)
            {
                const auto& Shaders = m_DeviceShaders[dev];
                if (Shaders.empty())
                    continue;
                Output << Ident1 << ArchiveDeviceTypeToString(dev) << '(' << Shaders.size() << ")\n";
                // ..OpenGL(2)

                std::vector<std::string> ShaderNames;
                ShaderNames.reserve(Shaders.size());

                size_t MaxSize    = 0;
                size_t MaxNameLen = 0;
                for (const auto& ShaderData : Shaders)
                {
                    MaxSize = std::max(MaxSize, ShaderData.Size());

                    ShaderCreateInfo                 ShaderCI;
                    Serializer<SerializerMode::Read> ShaderSer{ShaderData};
                    if (ShaderSerializer<SerializerMode::Read>::SerializeCI(ShaderSer, ShaderCI))
                        ShaderNames.emplace_back(std::string{'\''} + ShaderCI.Desc.Name + '\'');
                    else
                        ShaderNames.emplace_back("<Deserialization error>");
                    MaxNameLen = std::max(MaxNameLen, ShaderNames.back().size());
                }

                const auto IdxFieldW  = GetNumFieldWidth(Shaders.size());
                const auto SizeFieldW = GetNumFieldWidth(MaxSize);
                for (Uint32 idx = 0; idx < Shaders.size(); ++idx)
                {
                    Output << Ident2 << '[' << std::setw(static_cast<int>(IdxFieldW)) << std::right << idx << "] "
                           << std::setw(static_cast<int>(MaxNameLen)) << std::left << ShaderNames[idx] << ' '
                           << std::setw(static_cast<int>(SizeFieldW)) << std::right << Shaders[idx].Size() << " bytes\n";
                    // ....[0] 'Test VS' 4020 bytes
                }
            }
        }
    }

    return Output.str();
}